

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::LDY_ZP(CPU *this)

{
  byte bVar1;
  uint8_t uVar2;
  CPU *this_local;
  
  this->cycles = 3;
  bVar1 = GetByte(this);
  uVar2 = ReadByte(this,(ushort)bVar1);
  this->Y = uVar2;
  (this->field_6).ps = (this->field_6).ps & 0xfd | (this->Y == '\0') << 1;
  (this->field_6).ps =
       (this->field_6).ps & 0x7f | ((this->Y & 0x80) != 0 && -1 < (int)(this->Y & 0x80)) << 7;
  return;
}

Assistant:

void CPU::LDY_ZP()
{
    cycles = 3;
    Y = ReadByte(GetByte());
    Z = (Y == 0);
    N = (Y & 0b10000000) > 0;
}